

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_sshl_vec(TCGContext_conflict1 *tcg_ctx,uint vece,TCGv_vec dst,TCGv_vec src,TCGv_vec shift)

{
  TCGv_vec r;
  TCGv_vec r_00;
  TCGv_vec r_01;
  TCGv_vec r_02;
  TCGv_vec r_03;
  TCGv_vec c;
  TCGv_vec d;
  
  r = tcg_temp_new_vec_matching_aarch64(tcg_ctx,dst);
  r_00 = tcg_temp_new_vec_matching_aarch64(tcg_ctx,dst);
  r_01 = tcg_temp_new_vec_matching_aarch64(tcg_ctx,dst);
  r_02 = tcg_temp_new_vec_matching_aarch64(tcg_ctx,dst);
  r_03 = tcg_temp_new_vec_matching_aarch64(tcg_ctx,dst);
  tcg_gen_neg_vec_aarch64(tcg_ctx,vece,r_02,shift);
  if (vece == 0) {
    tcg_gen_mov_vec_aarch64(tcg_ctx,r_01,shift);
  }
  else {
    tcg_gen_dupi_vec_aarch64(tcg_ctx,vece,r_03,0xff);
    tcg_gen_and_vec_aarch64(tcg_ctx,vece,r_01,shift,r_03);
    tcg_gen_and_vec_aarch64(tcg_ctx,vece,r_02,r_02,r_03);
  }
  tcg_gen_dupi_vec_aarch64(tcg_ctx,vece,r_03,(long)((8 << ((byte)vece & 0x1f)) + -1));
  tcg_gen_umin_vec_aarch64(tcg_ctx,vece,r_02,r_02,r_03);
  tcg_gen_cmp_vec_aarch64(tcg_ctx,TCG_COND_GT,vece,r_03,r_01,r_03);
  tcg_gen_shlv_vec_aarch64(tcg_ctx,vece,r,src,r_01);
  tcg_gen_sarv_vec_aarch64(tcg_ctx,vece,r_00,src,r_02);
  tcg_gen_andc_vec_aarch64(tcg_ctx,vece,r,r,r_03);
  if (vece == 0) {
    tcg_gen_dupi_vec_aarch64(tcg_ctx,0,r_03,0);
    vece = 0;
    c = r_00;
    d = r;
  }
  else {
    tcg_gen_dupi_vec_aarch64(tcg_ctx,vece,r_03,0x80);
    c = r;
    d = r_00;
  }
  tcg_gen_cmpsel_vec_aarch64(tcg_ctx,TCG_COND_LT,vece,dst,r_01,r_03,c,d);
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(r + (long)tcg_ctx));
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(r_00 + (long)tcg_ctx));
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(r_01 + (long)tcg_ctx));
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(r_02 + (long)tcg_ctx));
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(r_03 + (long)tcg_ctx));
  return;
}

Assistant:

static void gen_sshl_vec(TCGContext *tcg_ctx, unsigned vece, TCGv_vec dst,
                         TCGv_vec src, TCGv_vec shift)
{
    TCGv_vec lval = tcg_temp_new_vec_matching(tcg_ctx, dst);
    TCGv_vec rval = tcg_temp_new_vec_matching(tcg_ctx, dst);
    TCGv_vec lsh = tcg_temp_new_vec_matching(tcg_ctx, dst);
    TCGv_vec rsh = tcg_temp_new_vec_matching(tcg_ctx, dst);
    TCGv_vec tmp = tcg_temp_new_vec_matching(tcg_ctx, dst);

    /*
     * Rely on the TCG guarantee that out of range shifts produce
     * unspecified results, not undefined behaviour (i.e. no trap).
     * Discard out-of-range results after the fact.
     */
    tcg_gen_neg_vec(tcg_ctx, vece, rsh, shift);
    if (vece == MO_8) {
        tcg_gen_mov_vec(tcg_ctx, lsh, shift);
    } else {
        tcg_gen_dupi_vec(tcg_ctx, vece, tmp, 0xff);
        tcg_gen_and_vec(tcg_ctx, vece, lsh, shift, tmp);
        tcg_gen_and_vec(tcg_ctx, vece, rsh, rsh, tmp);
    }

    /* Bound rsh so out of bound right shift gets -1.  */
    tcg_gen_dupi_vec(tcg_ctx, vece, tmp, (8 << vece) - 1);
    tcg_gen_umin_vec(tcg_ctx, vece, rsh, rsh, tmp);
    tcg_gen_cmp_vec(tcg_ctx, TCG_COND_GT, vece, tmp, lsh, tmp);

    tcg_gen_shlv_vec(tcg_ctx, vece, lval, src, lsh);
    tcg_gen_sarv_vec(tcg_ctx, vece, rval, src, rsh);

    /* Select in-bound left shift.  */
    tcg_gen_andc_vec(tcg_ctx, vece, lval, lval, tmp);

    /* Select between left and right shift.  */
    if (vece == MO_8) {
        tcg_gen_dupi_vec(tcg_ctx, vece, tmp, 0);
        tcg_gen_cmpsel_vec(tcg_ctx, TCG_COND_LT, vece, dst, lsh, tmp, rval, lval);
    } else {
        tcg_gen_dupi_vec(tcg_ctx, vece, tmp, 0x80);
        tcg_gen_cmpsel_vec(tcg_ctx, TCG_COND_LT, vece, dst, lsh, tmp, lval, rval);
    }

    tcg_temp_free_vec(tcg_ctx, lval);
    tcg_temp_free_vec(tcg_ctx, rval);
    tcg_temp_free_vec(tcg_ctx, lsh);
    tcg_temp_free_vec(tcg_ctx, rsh);
    tcg_temp_free_vec(tcg_ctx, tmp);
}